

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O1

TPM_RC TSS_PolicySecret(TSS_DEVICE *tpm,TSS_SESSION *session,TPMI_DH_ENTITY authHandle,
                       TSS_SESSION *policySession,TPM2B_NONCE *nonceTPM,INT32 expiration)

{
  TPM_RC TVar1;
  LOGGER_LOG p_Var2;
  TPM2B_TIMEOUT timeout;
  
  if (session == (TSS_SESSION *)0x0 || policySession == (TSS_SESSION *)0x0) {
    p_Var2 = xlogging_get_log_function();
    TVar1 = 0x101;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                ,"TSS_PolicySecret",0x1e3,1,
                "Invalid parameter specified policySession: %p session: %p",policySession,session);
    }
  }
  else {
    TVar1 = TPM2_PolicySecret(tpm,session,authHandle,(policySession->SessIn).sessionHandle,nonceTPM,
                              (TPM2B_DIGEST *)0x0,(TPM2B_NONCE *)0x0,expiration,&timeout,
                              (TPMT_TK_AUTH *)0x0);
  }
  return TVar1;
}

Assistant:

TPM_RC
TSS_PolicySecret(
    TSS_DEVICE             *tpm,                // IN/OUT
    TSS_SESSION            *session,            // IN/OUT
    TPMI_DH_ENTITY          authHandle,         // IN
    TSS_SESSION            *policySession,      // IN
    TPM2B_NONCE            *nonceTPM,           // IN
    INT32                   expiration          // IN
)
{
    TPM_RC result;
    TPM2B_TIMEOUT   timeout;
    if (session == NULL || policySession == NULL)
    {
        LogError("Invalid parameter specified policySession: %p session: %p", policySession, session);
        result = TPM_RC_FAILURE;
    }
    else
    {
        result = TPM2_PolicySecret(tpm, session, authHandle, policySession->SessIn.sessionHandle, nonceTPM, NULL, NULL, expiration, &timeout, NULL);
    }
    return result;
}